

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O2

bool __thiscall
QTableModel::setHeaderData
          (QTableModel *this,int section,Orientation orientation,QVariant *value,int role)

{
  long *plVar1;
  ulong uVar2;
  long lStack_8;
  
  if (-1 < section) {
    uVar2 = (ulong)(uint)section;
    if (orientation == Horizontal) {
      if ((ulong)(this->horizontalHeaderItems).d.size <= uVar2) {
        return false;
      }
      lStack_8 = 0x50;
    }
    else {
      if ((orientation == Vertical) && ((ulong)(this->verticalHeaderItems).d.size <= uVar2)) {
        return false;
      }
      lStack_8 = 0x38;
    }
    plVar1 = *(long **)(*(long *)(&this->super_QAbstractTableModel + lStack_8) + uVar2 * 8);
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 0x20))(plVar1,role,value);
      return true;
    }
  }
  return false;
}

Assistant:

bool QTableModel::setHeaderData(int section, Qt::Orientation orientation,
                                const QVariant &value, int role)
{
    if (section < 0 ||
       (orientation == Qt::Horizontal && horizontalHeaderItems.size() <= section) ||
       (orientation == Qt::Vertical && verticalHeaderItems.size() <= section))
    return false;

    QTableWidgetItem *itm = nullptr;
    if (orientation == Qt::Horizontal)
        itm = horizontalHeaderItems.at(section);
    else
        itm = verticalHeaderItems.at(section);
    if (itm) {
        itm->setData(role, value);
        return true;
    }
    return false;
}